

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O1

bool __thiscall
slang::ast::Bitstream::checkClassAccess
          (Bitstream *this,Type *type,ASTContext *context,SourceRange sourceRange)

{
  bool bVar1;
  specific_symbol_iterator<slang::ast::ClassPropertySymbol> symbol;
  Diagnostic *diag;
  SourceRange sourceRange_00;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_(std::ranges::subrange_kind)0>
  sVar2;
  
  sourceRange_00.endLoc = sourceRange.startLoc;
  if (*(long *)(this + 0x40) == 0) {
    Type::resolveCanonical((Type *)this);
  }
  if (**(int **)(this + 0x40) == 0x16) {
    sVar2 = Scope::membersOfType<slang::ast::ClassPropertySymbol>
                      ((Scope *)(*(long *)(this + 0x40) + 0x48));
    symbol = sVar2._M_begin.current;
joined_r0x004341aa:
    if (symbol.current != sVar2._M_end.current.current) {
      if (((*(int *)&symbol.current[5].location != 0) &&
          (*(int *)&symbol.current[5].name._M_str == 0)) &&
         (bVar1 = Lookup::isVisibleFrom(symbol.current,*(Scope **)&type->super_Symbol), !bVar1)) {
        sourceRange_00.startLoc = (SourceLocation)context;
        diag = ASTContext::addDiag((ASTContext *)type,(DiagCode)0x3d0007,sourceRange_00);
        ast::operator<<(diag,(Type *)this);
        return false;
      }
      do {
        symbol.current = (symbol.current)->nextInScope;
        if (symbol.current == (Symbol *)0x0) break;
      } while ((symbol.current)->kind != ClassProperty);
      goto joined_r0x004341aa;
    }
  }
  return true;
}

Assistant:

bool Bitstream::checkClassAccess(const Type& type, const ASTContext& context,
                                 SourceRange sourceRange) {
    if (!type.isClass())
        return true;

    auto& ct = type.getCanonicalType().as<ClassType>();
    for (auto& prop : ct.membersOfType<ClassPropertySymbol>()) {
        if (prop.visibility != Visibility::Public && prop.lifetime == VariableLifetime::Automatic) {
            if (!Lookup::isVisibleFrom(prop, *context.scope)) {
                context.addDiag(diag::ClassPrivateMembersBitstream, sourceRange) << type;
                return false;
            }
        }
    }
    return true;
}